

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionModelBullet.cpp
# Opt level: O2

bool __thiscall
chrono::collision::ChCollisionModelBullet::AddTriangleMeshConcave
          (ChCollisionModelBullet *this,shared_ptr<chrono::ChMaterialSurface> *material,
          shared_ptr<chrono::geometry::ChTriangleMesh> *trimesh,ChVector<double> *pos,
          ChMatrix33<double> *rot)

{
  element_type *peVar1;
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  cbtTriangleMesh *this_00;
  ChCollisionShapeBullet *this_01;
  cbtGImpactMeshShape_handlemesh *this_02;
  int i;
  uint uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 in_register_00001284 [12];
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_160;
  cbtVector3 local_150;
  cbtVector3 local_140;
  cbtVector3 local_130;
  undefined1 local_120 [56];
  undefined1 local_e8 [16];
  double local_d8;
  undefined1 local_d0 [32];
  undefined1 local_b0 [16];
  double local_a0;
  undefined1 local_80 [8];
  undefined1 local_78 [16];
  double local_68;
  
  iVar3 = (*(((trimesh->
              super___shared_ptr<chrono::geometry::ChTriangleMesh,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr)->super_ChGeometry)._vptr_ChGeometry[0xd])();
  if (iVar3 != 0) {
    this_00 = (cbtTriangleMesh *)cbtTriangleIndexVertexArray::operator_new(0xf0);
    cbtTriangleMesh::cbtTriangleMesh(this_00,true,true);
    uVar5 = 0;
    while( true ) {
      iVar4 = (*(((trimesh->
                  super___shared_ptr<chrono::geometry::ChTriangleMesh,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr)->super_ChGeometry)._vptr_ChGeometry[0xd])();
      if (iVar4 <= (int)uVar5) break;
      peVar1 = (trimesh->
               super___shared_ptr<chrono::geometry::ChTriangleMesh,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      (*(peVar1->super_ChGeometry)._vptr_ChGeometry[0xe])(local_80,peVar1,(ulong)uVar5);
      auVar2 = vcvtpd2ps_avx(local_78);
      auVar6._0_4_ = (float)local_68;
      auVar6._4_12_ = in_register_00001284;
      local_130.m_floats = (cbtScalar  [4])vinsertps_avx(auVar2,auVar6,0x28);
      peVar1 = (trimesh->
               super___shared_ptr<chrono::geometry::ChTriangleMesh,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      (*(peVar1->super_ChGeometry)._vptr_ChGeometry[0xe])(local_d0,peVar1,(ulong)uVar5);
      auVar2 = vcvtpd2ps_avx(local_b0);
      auVar7._0_4_ = (float)local_a0;
      auVar7._4_12_ = in_register_00001284;
      local_140.m_floats = (cbtScalar  [4])vinsertps_avx(auVar2,auVar7,0x28);
      peVar1 = (trimesh->
               super___shared_ptr<chrono::geometry::ChTriangleMesh,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      (*(peVar1->super_ChGeometry)._vptr_ChGeometry[0xe])(local_120,peVar1,(ulong)uVar5);
      auVar2 = vcvtpd2ps_avx(local_e8);
      auVar8._0_4_ = (float)local_d8;
      auVar8._4_12_ = in_register_00001284;
      local_150.m_floats = (cbtScalar  [4])vinsertps_avx(auVar2,auVar8,0x28);
      cbtTriangleMesh::addTriangle(this_00,&local_130,&local_140,&local_150,true);
      uVar5 = uVar5 + 1;
    }
    (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x22])(0,this);
    this_01 = (ChCollisionShapeBullet *)::operator_new(0x28);
    std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_160,
               &material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)
    ;
    ChCollisionShapeBullet::ChCollisionShapeBullet
              (this_01,TRIANGLEMESH,(shared_ptr<chrono::ChMaterialSurface> *)&local_160);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_160._M_refcount);
    this_02 = (cbtGImpactMeshShape_handlemesh *)cbtConcaveShape::operator_new(0xe8);
    cbtGImpactMeshShape_handlemesh::cbtGImpactMeshShape_handlemesh
              (this_02,(cbtStridingMeshInterface *)this_00);
    (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x25])(this);
    (*(this_02->super_cbtGImpactMeshShape).super_cbtGImpactShapeInterface.super_cbtConcaveShape.
      super_cbtCollisionShape._vptr_cbtCollisionShape[0xb])(this_02);
    if ((this_02->super_cbtGImpactMeshShape).super_cbtGImpactShapeInterface.m_needs_update == true)
    {
      (*(this_02->super_cbtGImpactMeshShape).super_cbtGImpactShapeInterface.super_cbtConcaveShape.
        super_cbtCollisionShape._vptr_cbtCollisionShape[0x11])(this_02);
      (this_02->super_cbtGImpactMeshShape).super_cbtGImpactShapeInterface.m_needs_update = false;
    }
    this_01->m_bt_shape = (cbtCollisionShape *)this_02;
    injectShape(this,pos,rot,this_01);
  }
  return iVar3 != 0;
}

Assistant:

bool ChCollisionModelBullet::AddTriangleMeshConcave(std::shared_ptr<ChMaterialSurface> material,
                                                    std::shared_ptr<geometry::ChTriangleMesh> trimesh,
                                                    const ChVector<>& pos,
                                                    const ChMatrix33<>& rot) {
    if (!trimesh->getNumTriangles())
        return false;

    cbtTriangleMesh* bulletMesh = new cbtTriangleMesh;
    for (int i = 0; i < trimesh->getNumTriangles(); i++) {
        // bulletMesh->m_weldingThreshold = ...
        bulletMesh->addTriangle(ChVectToBullet(trimesh->getTriangle(i).p1), ChVectToBullet(trimesh->getTriangle(i).p2),
                                ChVectToBullet(trimesh->getTriangle(i).p3),
                                true);  // try to remove duplicate vertices
    }

    SetSafeMargin(0);

    auto shape = new ChCollisionShapeBullet(ChCollisionShape::Type::TRIANGLEMESH, material);

    // Use the GImpact custom mesh-mesh algorithm
    auto bt_shape = new cbtGImpactMeshShape_handlemesh(bulletMesh);
    bt_shape->setMargin((cbtScalar)GetEnvelope());
    bt_shape->updateBound();
    shape->m_bt_shape = bt_shape;

    injectShape(pos, rot, shape);
    return true;
}